

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

void ncnn::compute_A_tile_int8_scales
               (Mat *A,Mat *scales,float B_scale,Mat *out_descales,int i,int max_ii)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  __m128 _absmax0;
  undefined1 auVar39 [64];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 auVar38 [32];
  
  iVar1 = A->elempack;
  if (0 < (int)((long)max_ii / (long)iVar1)) {
    iVar12 = A->w;
    uVar6 = iVar12 * iVar1;
    auVar20._0_4_ = 0.007874016 / B_scale;
    auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar20 = vshufps_avx(auVar20,auVar20,0);
    if (A->dims == 3) {
      iVar12 = (int)A->cstep;
    }
    lVar5 = (long)i;
    pauVar11 = (undefined1 (*) [32])((long)&out_descales->data + lVar5 * 4);
    pauVar10 = (undefined1 (*) [32])((long)&scales->data + lVar5 * 4);
    auVar22 = ZEXT464(0x3f800000);
    uVar7 = 0;
    auVar29 = ZEXT3264(CONCAT428(0x7fffffff,
                                 CONCAT424(0x7fffffff,
                                           CONCAT420(0x7fffffff,
                                                     CONCAT416(0x7fffffff,
                                                               CONCAT412(0x7fffffff,
                                                                         CONCAT48(0x7fffffff,
                                                                                  0x7fffffff7fffffff
                                                                                 )))))));
    auVar28 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar33 = ZEXT3264(_DAT_005a43c0);
    auVar34 = ZEXT3264(_DAT_005a43e0);
    auVar35._8_8_ = 0x8000000000000000;
    auVar35._0_8_ = 0x8000000000000000;
    auVar3 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
    do {
      pauVar15 = (undefined1 (*) [32])
                 ((uVar7 * (long)iVar1 + lVar5) * (long)iVar12 * 4 + (long)A->data);
      auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar38 = ZEXT1632(ZEXT816(0) << 0x40);
      if ((int)uVar6 < 8) {
        uVar16 = 0;
      }
      else {
        iVar8 = 7;
        do {
          auVar38 = vandps_avx(auVar29._0_32_,*pauVar15);
          auVar38 = vmaxps_avx(auVar39._0_32_,auVar38);
          auVar39 = ZEXT3264(auVar38);
          pauVar15 = pauVar15 + 1;
          iVar8 = iVar8 + 8;
          uVar16 = uVar6 & 0xfffffff8;
        } while (iVar8 < (int)uVar6);
      }
      auVar21 = ZEXT816(0) << 0x40;
      uVar9 = uVar16 | 3;
      while ((int)uVar9 < (int)uVar6) {
        auVar17 = vandps_avx(auVar28._0_16_,*(undefined1 (*) [16])*pauVar15);
        auVar21 = vmaxps_avx(auVar21,auVar17);
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        uVar9 = uVar16 + 7;
        uVar16 = uVar16 + 4;
      }
      auVar17 = ZEXT816(0) << 0x40;
      if ((int)uVar16 < (int)uVar6) {
        uVar13 = CONCAT44(0,~uVar16 + uVar6);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar13;
        auVar27 = vpshufd_avx(auVar17,0x44);
        auVar17 = vorps_avx(auVar27,auVar35);
        auVar26 = vorps_avx(auVar27,auVar35);
        uVar14 = 0;
        auVar22 = ZEXT1664(ZEXT816(0) << 0x40);
        do {
          auVar28 = auVar22;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar14;
          auVar23 = vpshufd_avx(auVar23,0x44);
          auVar25._16_16_ = auVar23;
          auVar25._0_16_ = auVar23;
          auVar18 = vorps_avx(auVar25,auVar33._0_32_);
          auVar2 = vorps_avx(auVar25,auVar34._0_32_);
          auVar23 = vorps_avx(auVar35,auVar27);
          auVar24._0_8_ = auVar2._16_8_ ^ 0x8000000000000000;
          auVar24._8_4_ = auVar2._24_4_;
          auVar24._12_4_ = auVar2._28_4_ ^ 0x80000000;
          auVar4 = vpcmpgtq_avx(auVar24,auVar23);
          auVar36._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
          auVar36._8_4_ = auVar2._8_4_;
          auVar36._12_4_ = auVar2._12_4_ ^ 0x80000000;
          auVar24 = vpcmpgtq_avx(auVar36,auVar17);
          auVar24 = vpackssdw_avx(auVar24,auVar4);
          auVar30._0_8_ = auVar18._16_8_ ^ 0x8000000000000000;
          auVar30._8_4_ = auVar18._24_4_;
          auVar30._12_4_ = auVar18._28_4_ ^ 0x80000000;
          auVar30 = vpcmpgtq_avx(auVar30,auVar23);
          auVar31._0_8_ = auVar18._0_8_ ^ 0x8000000000000000;
          auVar31._8_4_ = auVar18._8_4_;
          auVar31._12_4_ = auVar18._12_4_ ^ 0x80000000;
          auVar23 = vpcmpgtq_avx(auVar31,auVar26);
          auVar23 = vpackssdw_avx(auVar23,auVar30);
          auVar23 = vpackssdw_avx(auVar3 ^ auVar23,auVar24 ^ auVar3);
          auVar24 = vpmovsxwd_avx(auVar23);
          auVar23 = vpunpckhwd_avx(auVar23,auVar23);
          auVar32._16_16_ = auVar23;
          auVar32._0_16_ = auVar24;
          auVar25 = vmaskmovps_avx(auVar32,*(undefined1 (*) [32])(*pauVar15 + uVar14 * 4));
          auVar37._8_4_ = 0x7fffffff;
          auVar37._0_8_ = 0x7fffffff7fffffff;
          auVar37._12_4_ = 0x7fffffff;
          auVar37._16_4_ = 0x7fffffff;
          auVar37._20_4_ = 0x7fffffff;
          auVar37._24_4_ = 0x7fffffff;
          auVar37._28_4_ = 0x7fffffff;
          auVar25 = vandps_avx(auVar37,auVar25);
          auVar25 = vmaxps_avx(auVar25,auVar28._0_32_);
          auVar33 = ZEXT3264(auVar33._0_32_);
          auVar34 = ZEXT3264(auVar34._0_32_);
          uVar14 = uVar14 + 8;
          auVar22 = ZEXT3264(auVar25);
        } while ((uVar13 + 8 & 0xfffffffffffffff8) != uVar14);
        auVar17 = vorps_avx(auVar27,auVar35);
        auVar26._0_8_ = auVar2._0_8_ ^ 0x8000000000000000;
        auVar26._8_4_ = auVar2._8_4_;
        auVar26._12_4_ = auVar2._12_4_ ^ 0x80000000;
        auVar17 = vpcmpgtq_avx(auVar26,auVar17);
        auVar26 = vpackssdw_avx(auVar17,auVar4);
        auVar17 = vorps_avx(auVar27,auVar35);
        auVar27._0_8_ = auVar18._0_8_ ^ 0x8000000000000000;
        auVar27._8_4_ = auVar18._8_4_;
        auVar27._12_4_ = auVar18._12_4_ ^ 0x80000000;
        auVar17 = vpcmpgtq_avx(auVar27,auVar17);
        auVar17 = vpackssdw_avx(auVar17,auVar30);
        auVar17 = vblendvps_avx(auVar28._0_16_,auVar25._0_16_,auVar3 ^ auVar17);
        auVar26 = vblendvps_avx(auVar28._16_16_,auVar25._16_16_,auVar3 ^ auVar26);
        auVar17 = vmaxps_avx(auVar17,auVar26);
        auVar26 = vshufpd_avx(auVar17,auVar17,1);
        auVar17 = vmaxps_avx(auVar17,auVar26);
        auVar26 = vmovshdup_avx(auVar17);
        auVar22 = ZEXT1664(auVar26);
        auVar17 = vmaxss_avx(auVar17,auVar26);
        auVar28 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        auVar29 = ZEXT3264(CONCAT428(0x7fffffff,
                                     CONCAT424(0x7fffffff,
                                               CONCAT420(0x7fffffff,
                                                         CONCAT416(0x7fffffff,
                                                                   CONCAT412(0x7fffffff,
                                                                             CONCAT48(0x7fffffff,
                                                                                                                                                                            
                                                  0x7fffffff7fffffff)))))));
      }
      if (iVar1 == 1) {
        auVar26 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
        auVar27 = vshufpd_avx(auVar26,auVar26,3);
        auVar26 = vmaxps_avx(auVar26,auVar27);
        auVar27 = vmovshdup_avx(auVar26);
        auVar26 = vmaxss_avx(auVar26,auVar27);
        auVar17 = vmaxss_avx(auVar26,auVar17);
        auVar26 = vshufpd_avx(auVar21,auVar21,3);
        auVar21 = vmaxps_avx(auVar21,auVar26);
        auVar26 = vmovshdup_avx(auVar21);
        auVar21 = vmaxss_avx(auVar21,auVar26);
        auVar21 = vmaxss_avx(auVar21,auVar17);
        fVar19 = 127.0 / auVar21._0_4_;
        auVar22 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar19));
        *(float *)*pauVar10 = fVar19;
        *(float *)*pauVar11 = auVar21._0_4_ * 0.007874016 * (1.0 / B_scale);
        pauVar10 = (undefined1 (*) [32])(*pauVar10 + 4);
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
      }
      else {
        local_68 = auVar20._0_4_;
        fStack_64 = auVar20._4_4_;
        fStack_60 = auVar20._8_4_;
        fStack_5c = auVar20._12_4_;
        if (iVar1 == 4) {
          auVar17 = vmaxps_avx(auVar38._0_16_,auVar38._16_16_);
          auVar17 = vmaxps_avx(auVar21,auVar17);
          auVar21._8_4_ = 0x42fe0000;
          auVar21._0_8_ = 0x42fe000042fe0000;
          auVar21._12_4_ = 0x42fe0000;
          auVar21 = vdivps_avx(auVar21,auVar17);
          auVar22 = ZEXT1664(auVar21);
          *(undefined1 (*) [16])*pauVar10 = auVar21;
          *(float *)*pauVar11 = auVar17._0_4_ * local_68;
          *(float *)(*pauVar11 + 4) = auVar17._4_4_ * fStack_64;
          *(float *)(*pauVar11 + 8) = auVar17._8_4_ * fStack_60;
          *(float *)(*pauVar11 + 0xc) = auVar17._12_4_ * fStack_5c;
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        }
        else if (iVar1 == 8) {
          auVar18._8_4_ = 0x42fe0000;
          auVar18._0_8_ = 0x42fe000042fe0000;
          auVar18._12_4_ = 0x42fe0000;
          auVar18._16_4_ = 0x42fe0000;
          auVar18._20_4_ = 0x42fe0000;
          auVar18._24_4_ = 0x42fe0000;
          auVar18._28_4_ = 0x42fe0000;
          auVar25 = vdivps_avx(auVar18,auVar38);
          auVar39._0_4_ = auVar38._0_4_ * local_68;
          auVar39._4_4_ = auVar38._4_4_ * fStack_64;
          auVar39._8_4_ = auVar38._8_4_ * fStack_60;
          auVar39._12_4_ = auVar38._12_4_ * fStack_5c;
          auVar39._16_4_ = auVar38._16_4_ * local_68;
          auVar39._20_4_ = auVar38._20_4_ * fStack_64;
          auVar39._28_36_ = auVar22._28_36_;
          auVar39._24_4_ = auVar38._24_4_ * fStack_60;
          auVar22 = ZEXT3264(auVar39._0_32_);
          *pauVar10 = auVar25;
          *pauVar11 = auVar39._0_32_;
          pauVar10 = pauVar10 + 1;
          pauVar11 = pauVar11 + 1;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != ((long)max_ii / (long)iVar1 & 0xffffffffU));
  }
  return;
}

Assistant:

static void compute_A_tile_int8_scales(const Mat& A, Mat& scales, float B_scale, Mat& out_descales, int i, int max_ii)
{
    compute_A_tile_fp32_int8_scales(A, scales, B_scale, out_descales, i, max_ii);
}